

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndPreserveBufferTest::iterate
          (SwapBuffersWithDamageAndPreserveBufferTest *this)

{
  Frame *frame;
  NativeWindow *pNVar1;
  int iVar2;
  EGLint numFrames;
  EGLint width;
  deUint32 dVar3;
  int iVar4;
  Library *egl;
  int *piVar5;
  int in_R9D;
  uint uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  Vec4 clearColor;
  vector<int,_std::allocator<int>_> damageRegion;
  FrameSequence frameSequence;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,(this->super_SwapBuffersWithDamageTest).m_seed);
  egl = EglTestContext::getLibrary
                  ((this->super_SwapBuffersWithDamageTest).super_TestCase.m_eglTestCtx);
  numFrames = eglu::querySurfaceInt
                        (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                         (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3057);
  width = eglu::querySurfaceInt
                    (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                     (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3056);
  fVar8 = deRandom_getFloat(&rnd.m_rnd);
  fVar9 = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[3] = 1.0;
  clearColor.m_data[0] = fVar8;
  clearColor.m_data[1] = fVar9;
  generateFrameSequence
            (&frameSequence,&(this->super_SwapBuffersWithDamageTest).m_frameDrawType,
             (Random *)&rnd.m_rnd,numFrames,width,in_R9D);
  tcu::TestContext::setTestResult
            ((this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
             (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3093,0x3094);
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x1eb);
  iVar4 = width / 2;
  iVar2 = numFrames * 2;
  for (uVar6 = 0; (int)uVar6 < (this->super_SwapBuffersWithDamageTest).m_iterationTimes;
      uVar6 = uVar6 + 1) {
    clearColorScreen(&(this->super_SwapBuffersWithDamageTest).m_gl,&clearColor);
    (*egl->_vptr_Library[0x32])
              (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
               (this->super_SwapBuffersWithDamageTest).m_eglSurface,0,0);
    dVar3 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar3,"swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x1f0);
    for (lVar7 = 0; lVar7 != 0x300; lVar7 = lVar7 + 0x20) {
      frame = (Frame *)((long)&(frameSequence.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start)->width + lVar7);
      getDamageRegion((vector<int,_std::allocator<int>_> *)
                      &damageRegion.super__Vector_base<int,_std::allocator<int>_>,frame);
      GLES2Renderer::render
                ((this->super_SwapBuffersWithDamageTest).m_gles2Renderer,numFrames,width,frame);
      if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_BEFORE_SWAP) {
        if ((uVar6 & 1) == 0) {
          piVar5 = &local_98;
          local_98 = iVar2;
          local_94 = iVar4;
        }
        else {
          piVar5 = &local_a0;
          local_a0 = iVar4;
          local_9c = iVar2;
        }
        pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
        (*pNVar1->_vptr_NativeWindow[6])(pNVar1,piVar5);
      }
      (*egl->_vptr_Library[0x32])
                (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                 (this->super_SwapBuffersWithDamageTest).m_eglSurface);
      dVar3 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar3,
                       "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x201);
      if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_AFTER_SWAP) {
        if ((uVar6 & 1) == 0) {
          piVar5 = &local_a8;
          local_a8 = iVar2;
          local_a4 = iVar4;
        }
        else {
          piVar5 = &local_b0;
          local_b0 = iVar4;
          local_ac = iVar2;
        }
        pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
        (*pNVar1->_vptr_NativeWindow[6])(pNVar1,piVar5);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&damageRegion.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&frameSequence);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageAndPreserveBufferTest::iterate (void)
{

	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		clearColorScreen(m_gl, clearColor);
		EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));

		for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
		{
			const Frame&	currentFrame = frameSequence[frameNdx];
			vector<EGLint>	damageRegion = getDamageRegion(currentFrame);

			m_gles2Renderer->render(width, height, currentFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}

	return STOP;
}